

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O1

uint8_t * __thiscall
proto2_unittest::TestExtensionOrderings2_TestExtensionOrderings3::_InternalSerialize
          (TestExtensionOrderings2_TestExtensionOrderings3 *this,uint8_t *target,
          EpsCopyOutputStream *stream)

{
  ulong uVar1;
  uint8_t *puVar2;
  char *in_R9;
  undefined8 *puVar3;
  string_view s;
  string_view field_name;
  
  if ((undefined1  [16])((undefined1  [16])this->field_0 & (undefined1  [16])0x1) !=
      (undefined1  [16])0x0) {
    puVar3 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.my_string_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name._M_str = in_R9;
    field_name._M_len =
         (size_t)"proto2_unittest.TestExtensionOrderings2.TestExtensionOrderings3.my_string";
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar3,(char *)(ulong)*(uint *)(puVar3 + 1),1,0x49,field_name);
    s._M_str = (char *)*puVar3;
    s._M_len = puVar3[1];
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,s,target);
  }
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) == 0) {
    return target;
  }
  puVar2 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar2;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestExtensionOrderings2_TestExtensionOrderings3::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestExtensionOrderings2_TestExtensionOrderings3& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestExtensionOrderings2.TestExtensionOrderings3)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // string my_string = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_my_string();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "proto2_unittest.TestExtensionOrderings2.TestExtensionOrderings3.my_string");
    target = stream->WriteStringMaybeAliased(1, _s, target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestExtensionOrderings2.TestExtensionOrderings3)
  return target;
}